

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O1

bool slang::ast::TaggedPattern::createVars
               (ASTContext *context,TaggedPatternSyntax *syntax,Type *targetType,
               SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *results)

{
  PatternSyntax *syntax_00;
  bool bVar1;
  Scope *this;
  Symbol *pSVar2;
  Type *targetType_00;
  Diagnostic *pDVar3;
  string_view name;
  SourceRange SVar4;
  
  bVar1 = Type::isTaggedUnion(targetType);
  if (bVar1) {
    name = parsing::Token::valueText(&syntax->memberName);
    if (targetType->canonical == (Type *)0x0) {
      Type::resolveCanonical(targetType);
    }
    this = Symbol::scopeOrNull(&targetType->canonical->super_Symbol);
    pSVar2 = Scope::find(this,name);
    if (pSVar2 != (Symbol *)0x0) {
      syntax_00 = syntax->pattern;
      if (syntax_00 == (PatternSyntax *)0x0) {
        return true;
      }
      targetType_00 = DeclaredType::getType((DeclaredType *)(pSVar2 + 1));
      bVar1 = Pattern::createPatternVars(context,syntax_00,targetType_00,results);
      return bVar1;
    }
    if (name._M_len != 0) {
      SVar4 = parsing::Token::range(&syntax->memberName);
      pDVar3 = ASTContext::addDiag(context,(DiagCode)0x3a000a,SVar4);
      pDVar3 = Diagnostic::operator<<(pDVar3,name);
      ast::operator<<(pDVar3,targetType);
    }
  }
  else {
    if (targetType->canonical == (Type *)0x0) {
      Type::resolveCanonical(targetType);
    }
    if ((targetType->canonical->super_Symbol).kind != ErrorType) {
      SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pDVar3 = ASTContext::addDiag(context,(DiagCode)0x880007,SVar4);
      ast::operator<<(pDVar3,targetType);
    }
  }
  Pattern::createPlaceholderVars(context,&syntax->super_PatternSyntax,results);
  return false;
}

Assistant:

bool TaggedPattern::createVars(const ASTContext& context, const syntax::TaggedPatternSyntax& syntax,
                               const Type& targetType,
                               SmallVector<const PatternVarSymbol*>& results) {
    if (!targetType.isTaggedUnion()) {
        if (!targetType.isError())
            context.addDiag(diag::PatternTaggedType, syntax.sourceRange()) << targetType;

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    auto memberName = syntax.memberName.valueText();
    auto member = targetType.getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.memberName.range());
            diag << memberName << targetType;
        }

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    if (!syntax.pattern)
        return true;

    auto& field = member->as<FieldSymbol>();
    return createPatternVars(context, *syntax.pattern, field.getType(), results);
}